

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgsStreamReader.cpp
# Opt level: O1

int PGSStreamReader::calcFpsIndex(double fps)

{
  ulong uVar1;
  undefined4 *puVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  ostringstream ss;
  undefined1 *local_1b0;
  undefined8 local_1a8;
  undefined1 local_1a0;
  undefined7 uStack_19f;
  undefined8 uStack_198;
  ostringstream local_190 [376];
  
  dVar6 = pgs_frame_rates[0] - fps;
  uVar4 = -(ulong)(dVar6 < -dVar6);
  uVar1 = 0;
  bVar3 = false;
  if (0.0001 <= (double)(~uVar4 & (ulong)dVar6 | (ulong)-dVar6 & uVar4)) {
    uVar1 = 0;
    do {
      uVar4 = uVar1;
      if (uVar4 == 0xf) goto LAB_001c9821;
      dVar6 = pgs_frame_rates[uVar4 + 1] - fps;
      uVar5 = -(ulong)(dVar6 < -dVar6);
      uVar1 = uVar4 + 1;
    } while (0.0001 <= (double)(~uVar5 & (ulong)dVar6 | (ulong)-dVar6 & uVar5));
    bVar3 = 0xe < uVar4;
  }
  if (!bVar3) {
    return (int)uVar1;
  }
LAB_001c9821:
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Non standard fps value are not supported for PGS streams",0x38);
  puVar2 = (undefined4 *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  *puVar2 = 3;
  *(undefined4 **)(puVar2 + 2) = puVar2 + 6;
  if (local_1b0 == &local_1a0) {
    *(ulong *)(puVar2 + 6) = CONCAT71(uStack_19f,local_1a0);
    *(undefined8 *)(puVar2 + 8) = uStack_198;
  }
  else {
    *(undefined1 **)(puVar2 + 2) = local_1b0;
    *(ulong *)(puVar2 + 6) = CONCAT71(uStack_19f,local_1a0);
  }
  *(undefined8 *)(puVar2 + 4) = local_1a8;
  local_1a0 = 0;
  __cxa_throw(puVar2,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
}

Assistant:

int PGSStreamReader::calcFpsIndex(const double fps)
{
    for (int i = 0; i < 16; i++)
        if (fabs(pgs_frame_rates[i] - fps) < 1e-4)
            return i;
    THROW(ERR_COMMON, "Non standard fps value are not supported for PGS streams")
}